

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void check_interrupt_switch(SignalSwitcher *ss)

{
  runtime_error *this;
  SignalSwitcher *in_stack_ffffffffffffffe0;
  
  if (interrupt_switch) {
    SignalSwitcher::restore_handle(in_stack_ffffffffffffffe0);
    fprintf(_stderr,"%s","Error: procedure was interrupted\n");
    raise(2);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Error: procedure was interrupted.\n");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void check_interrupt_switch(SignalSwitcher &ss)
{
    if (interrupt_switch)
    {
        ss.restore_handle();
        print_errmsg("Error: procedure was interrupted\n");
        raise(SIGINT);
        #ifdef _FOR_R
        Rcpp::checkUserInterrupt();
        #elif !defined(DONT_THROW_ON_INTERRUPT)
        throw std::runtime_error("Error: procedure was interrupted.\n");
        #endif
    }
}